

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O0

void AES_encrypt(uchar *in,uchar *out,AES_KEY *key)

{
  undefined8 in_RCX;
  int local_3c;
  undefined1 local_38 [4];
  int round;
  AES_state s;
  uchar *plain16_local;
  uchar *cipher16_local;
  AES_state *pAStack_10;
  int nrounds_local;
  AES_state *rounds_local;
  
  s.slice._8_8_ = in_RCX;
  memset(local_38,0,0x10);
  LoadBytes((AES_state *)local_38,(uchar *)s.slice._8_8_);
  AddRoundKey((AES_state *)local_38,(AES_state *)in);
  pAStack_10 = (AES_state *)(in + 0x10);
  for (local_3c = 1; local_3c < (int)out; local_3c = local_3c + 1) {
    SubBytes((AES_state *)local_38,0);
    ShiftRows((AES_state *)local_38);
    MixColumns((AES_state *)local_38,0);
    AddRoundKey((AES_state *)local_38,pAStack_10);
    pAStack_10 = pAStack_10 + 1;
  }
  SubBytes((AES_state *)local_38,0);
  ShiftRows((AES_state *)local_38);
  AddRoundKey((AES_state *)local_38,pAStack_10);
  SaveBytes((uchar *)key,(AES_state *)local_38);
  return;
}

Assistant:

static void AES_encrypt(const AES_state* rounds, int nrounds, unsigned char* cipher16, const unsigned char* plain16) {
    AES_state s = {{0}};
    int round;

    LoadBytes(&s, plain16);
    AddRoundKey(&s, rounds++);

    for (round = 1; round < nrounds; round++) {
        SubBytes(&s, 0);
        ShiftRows(&s);
        MixColumns(&s, 0);
        AddRoundKey(&s, rounds++);
    }

    SubBytes(&s, 0);
    ShiftRows(&s);
    AddRoundKey(&s, rounds);

    SaveBytes(cipher16, &s);
}